

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_bind_socket(int sock,sockaddr_can *addr)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  
  iVar1 = bind(sock,(sockaddr *)addr,0x18);
  __errnum = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"failed to bind: %d (%s)",(ulong)__errnum,pcVar3);
  }
  return __errnum;
}

Assistant:

int libj1939_bind_socket(int sock, struct sockaddr_can *addr)
{
	int ret;

	ret = bind(sock, (void *)addr, sizeof(*addr));
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to bind: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}